

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.hpp
# Opt level: O1

int __thiscall
pstore::sstring_view<std::shared_ptr<const_char>_>::compare<char[6]>
          (sstring_view<std::shared_ptr<const_char>_> *this,char (*s) [6])

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  sVar4 = strlen(*s);
  uVar2 = this->size_;
  uVar6 = uVar2;
  if (sVar4 < uVar2) {
    uVar6 = sVar4;
  }
  bVar3 = true;
  if (uVar6 == 0) {
    uVar5 = 0;
  }
  else {
    uVar7 = 0;
    uVar5 = 0;
    do {
      cVar1 = (this->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[uVar7];
      if (cVar1 < (*s)[uVar7]) {
        uVar5 = 0xffffffff;
LAB_001b45e0:
        bVar3 = false;
        break;
      }
      if ((*s)[uVar7] < cVar1) {
        uVar5 = 1;
        goto LAB_001b45e0;
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  if ((bVar3) && (uVar5 = 0, uVar2 != sVar4)) {
    uVar5 = -(uint)(uVar2 < sVar4) | 1;
  }
  return uVar5;
}

Assistant:

int sstring_view<PointerType>::compare (StringType const & s) const {
        auto const slen = string_traits<StringType>::length (s);
        size_type const common_len = std::min (size (), slen);
        int result = traits::compare (data (), string_traits<StringType>::data (s), common_len);
        if (result == 0) {
            result = (size () == slen) ? 0 : (size () < slen ? -1 : 1);
        }
        return result;
    }